

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QPointer<QMdiSubWindow>,QPointer<QMdiSubWindow>>
                    (QList<QPointer<QMdiSubWindow>_> *vector,QPointer<QMdiSubWindow> *u,
                    qsizetype from)

{
  long lVar1;
  ulong uVar2;
  QPointer<QMdiSubWindow> *pQVar3;
  Data *pDVar4;
  long lVar5;
  qsizetype qVar6;
  QObject *pQVar7;
  QObject *pQVar8;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar2 = (vector->d).size;
  if ((ulong)from < uVar2) {
    pQVar3 = (vector->d).ptr;
    pDVar4 = (u->wp).d;
    qVar6 = from * 0x10 + -0x10;
    do {
      lVar1 = uVar2 * -0x10 + qVar6;
      if (lVar1 == -0x10) goto LAB_0044ef9c;
      lVar5 = *(long *)((long)&pQVar3[1].wp.d + qVar6);
      if ((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = *(QObject **)((long)&pQVar3[1].wp.value + qVar6);
      }
      if (pDVar4 == (Data *)0x0) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = (u->wp).value;
        if (*(int *)(pDVar4 + 4) == 0) {
          pQVar8 = (QObject *)0x0;
        }
      }
      qVar6 = qVar6 + 0x10;
    } while (pQVar7 != pQVar8);
    qVar6 = qVar6 >> 4;
LAB_0044ef9c:
    if (lVar1 != -0x10) {
      return qVar6;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}